

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *
deqp::gles31::Functional::anon_unknown_0::getCubeLevelAccesses
          (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           *__return_storage_ptr__,
          vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
          *data,ImageInfo *info,int faceNdx)

{
  int iVar1;
  int level;
  long lVar2;
  long lVar3;
  IVec3 levelTexelBlockSize;
  IVec3 levelPixelSize;
  TextureFormat format;
  IVec3 texelBlockPixelSize;
  IVec3 size;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  ImageInfo *local_80;
  TextureFormat local_78;
  IVec3 local_70;
  Vector<int,_3> local_64;
  ConstPixelBufferAccess local_58;
  
  local_78 = glu::mapGLInternalFormat(info->m_format);
  tcu::Vector<int,_3>::Vector(&local_64,&info->m_size);
  iVar1 = getTexelBlockSize(info->m_format);
  local_80 = info;
  getTexelBlockPixelSize((anon_unknown_0 *)&local_70,info->m_format);
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar3 = 0;
  for (lVar2 = 0;
      lVar2 < (int)((ulong)((long)(data->
                                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(data->
                                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar2 = lVar2 + 1) {
    getLevelSize((anon_unknown_0 *)&local_8c,local_80->m_target,&local_64,(int)lVar2);
    divRoundUp((anon_unknown_0 *)&local_98,(IVec3 *)&local_8c,&local_70);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_58,&local_78,local_8c,local_88,local_84,
               (void *)((long)(local_98 * iVar1 * faceNdx * local_94 * local_90) +
                       *(long *)((long)&((data->
                                         super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar3)
                       ));
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    emplace_back<tcu::ConstPixelBufferAccess>(__return_storage_ptr__,&local_58);
    lVar3 = lVar3 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::ConstPixelBufferAccess> getCubeLevelAccesses (const vector<ArrayBuffer<deUint8> >&	data,
														  const ImageInfo&						info,
														  int									faceNdx)
{
	const tcu::TextureFormat			format				= glu::mapGLInternalFormat(info.getFormat());
	const IVec3							size				= info.getSize();
	const int							texelBlockSize		= getTexelBlockSize(info.getFormat());
	const IVec3							texelBlockPixelSize = getTexelBlockPixelSize(info.getFormat());
	vector<tcu::ConstPixelBufferAccess>	result;

	DE_ASSERT(info.getTarget() == GL_TEXTURE_CUBE_MAP);
	DE_ASSERT((int)data.size() == getLevelCount(info));

	for (int level = 0; level < (int)data.size(); level++)
	{
		const IVec3 levelPixelSize			= getLevelSize(info.getTarget(), size, level);
		const IVec3	levelTexelBlockSize		= divRoundUp(levelPixelSize, texelBlockPixelSize);
		const int	levelTexelBlockCount	= levelTexelBlockSize.x() * levelTexelBlockSize.y() * levelTexelBlockSize.z();
		const int	levelSize				= levelTexelBlockCount * texelBlockSize;

		result.push_back(tcu::ConstPixelBufferAccess(format, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), data[level].getElementPtr(levelSize * faceNdx)));
	}

	return result;
}